

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_lite.cc
# Opt level: O1

bool google::protobuf::internal::ParseAnyTypeUrl
               (string *type_url,string *url_prefix,string *full_type_name)

{
  bool bVar1;
  long lVar2;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  lVar2 = std::__cxx11::string::find_last_of((char *)type_url,0x3a1155,0xffffffffffffffff);
  if ((lVar2 == -1) || (lVar2 + 1U == type_url->_M_string_length)) {
    bVar1 = false;
  }
  else {
    if (url_prefix != (string *)0x0) {
      std::__cxx11::string::substr((ulong)local_48,(ulong)type_url);
      std::__cxx11::string::operator=((string *)url_prefix,(string *)local_48);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0]);
      }
    }
    std::__cxx11::string::substr((ulong)local_48,(ulong)type_url);
    std::__cxx11::string::operator=((string *)full_type_name,(string *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool ParseAnyTypeUrl(const std::string& type_url, std::string* url_prefix,
                     std::string* full_type_name) {
  size_t pos = type_url.find_last_of("/");
  if (pos == std::string::npos || pos + 1 == type_url.size()) {
    return false;
  }
  if (url_prefix) {
    *url_prefix = type_url.substr(0, pos + 1);
  }
  *full_type_name = type_url.substr(pos + 1);
  return true;
}